

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_constant_names.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char **argv_local;
  int argc_local;
  
  if (((argc < 2) || (iVar1 = strcmp(argv[1],"help"), iVar1 == 0)) ||
     (iVar1 = strcmp(argv[1],"--help"), iVar1 == 0)) {
    usage(*argv);
    return 1;
  }
  iVar1 = strcmp(argv[1],"error");
  if ((iVar1 == 0) || (iVar1 = strcmp(argv[1],"status"), iVar1 == 0)) {
    iVar1 = process_signed(TYPE_STATUS,-0x80000000,0x7fffffff,argv + 2);
    return iVar1;
  }
  iVar1 = strcmp(argv[1],"alg");
  if ((iVar1 == 0) || (iVar1 = strcmp(argv[1],"algorithm"), iVar1 == 0)) {
    iVar1 = process_unsigned(TYPE_ALGORITHM,0xffffffff,argv + 2);
    return iVar1;
  }
  iVar1 = strcmp(argv[1],"curve");
  if ((iVar1 == 0) || (iVar1 = strcmp(argv[1],"ecc_curve"), iVar1 == 0)) {
    iVar1 = process_unsigned(TYPE_ECC_CURVE,0xff,argv + 2);
    return iVar1;
  }
  iVar1 = strcmp(argv[1],"group");
  if ((iVar1 == 0) || (iVar1 = strcmp(argv[1],"dh_group"), iVar1 == 0)) {
    iVar1 = process_unsigned(TYPE_DH_GROUP,0xff,argv + 2);
    return iVar1;
  }
  iVar1 = strcmp(argv[1],"type");
  if ((iVar1 == 0) || (iVar1 = strcmp(argv[1],"key_type"), iVar1 == 0)) {
    iVar1 = process_unsigned(TYPE_KEY_TYPE,0xffff,argv + 2);
    return iVar1;
  }
  iVar1 = strcmp(argv[1],"usage");
  if ((iVar1 != 0) && (iVar1 = strcmp(argv[1],"key_usage"), iVar1 != 0)) {
    printf("Unknown type: %s\n",argv[1]);
    return 1;
  }
  iVar1 = process_unsigned(TYPE_KEY_USAGE,0xffffffff,argv + 2);
  return iVar1;
}

Assistant:

int main(int argc, char *argv[])
{
    if (argc <= 1 ||
        !strcmp(argv[1], "help") ||
        !strcmp(argv[1], "--help"))
    {
        usage(argv[0]);
        return EXIT_FAILURE;
    }

    if (!strcmp(argv[1], "error") || !strcmp(argv[1], "status")) {
        /* There's no way to obtain the actual range of a signed type,
         * so hard-code it here: psa_status_t is int32_t. */
        return process_signed(TYPE_STATUS, INT32_MIN, INT32_MAX,
                              argv + 2);
    } else if (!strcmp(argv[1], "alg") || !strcmp(argv[1], "algorithm")) {
        return process_unsigned(TYPE_ALGORITHM, (psa_algorithm_t) (-1),
                                argv + 2);
    } else if (!strcmp(argv[1], "curve") || !strcmp(argv[1], "ecc_curve")) {
        return process_unsigned(TYPE_ECC_CURVE, (psa_ecc_curve_t) (-1),
                                argv + 2);
    } else if (!strcmp(argv[1], "group") || !strcmp(argv[1], "dh_group")) {
        return process_unsigned(TYPE_DH_GROUP, (psa_dh_group_t) (-1),
                                argv + 2);
    } else if (!strcmp(argv[1], "type") || !strcmp(argv[1], "key_type")) {
        return process_unsigned(TYPE_KEY_TYPE, (psa_key_type_t) (-1),
                                argv + 2);
    } else if (!strcmp(argv[1], "usage") || !strcmp(argv[1], "key_usage")) {
        return process_unsigned(TYPE_KEY_USAGE, (psa_key_usage_t) (-1),
                                argv + 2);
    } else {
        printf("Unknown type: %s\n", argv[1]);
        return EXIT_FAILURE;
    }
}